

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O2

int ecx_readODlist(ecx_contextt *context,uint16 Slave,ec_ODlistt *pODlist)

{
  ushort uVar1;
  uint8 uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  
  pODlist->Slave = Slave;
  pODlist->Entries = 0;
  ec_clearmbx(&MbxIn);
  ecx_mbxreceive(context,Slave,&MbxIn,0);
  ec_clearmbx(&MbxOut);
  MbxOut[0] = '\b';
  MbxOut[1] = '\0';
  MbxOut[2] = '\0';
  MbxOut[3] = '\0';
  MbxOut[4] = '\0';
  uVar7 = CONCAT62(in_register_00000032,Slave) & 0xffffffff;
  uVar2 = ec_nextmbxcnt(context->slavelist[uVar7].mbx_cnt);
  context->slavelist[uVar7].mbx_cnt = uVar2;
  MbxOut[5] = uVar2 << 4 | 3;
  MbxOut[6] = '\0';
  MbxOut[7] = 0x80;
  MbxOut[8] = '\x01';
  MbxOut[9] = '\0';
  MbxOut[10] = '\0';
  MbxOut[0xb] = '\0';
  MbxOut[0xc] = '\x01';
  MbxOut[0xd] = '\0';
  iVar3 = ecx_mbxsend(context,Slave,&MbxOut,20000);
  if (0 < iVar3) {
    iVar9 = -8;
    lVar5 = 1;
    uVar8 = 0;
    uVar6 = 0;
    while( true ) {
      ec_clearmbx(&MbxIn);
      iVar3 = ecx_mbxreceive(context,Slave,&MbxIn,700000);
      if (iVar3 < 1) break;
      if (((MbxIn[5] & 0xf) != 3) || ((MbxIn[8] & 0x7f) != 2)) {
        if ((MbxIn[8] & 0x7f) == 7) {
          ecx_SDOinfoerror(context,Slave,0,'\0',MbxIn._12_4_);
          return 0;
        }
        ecx_packeterror(context,Slave,0,'\0',1);
        return 0;
      }
      uVar10 = (int)(iVar9 + (uint)(ushort)MbxIn._0_2_) / 2;
      if (0x400 < (uVar10 & 0xffff) + (uVar6 & 0xffff)) {
        uVar10 = 0x401 - uVar6;
        ecx_SDOinfoerror(context,Slave,0,'\0',0xf000000);
      }
      uVar1 = pODlist->Entries;
      uVar4 = uVar10 & 0xffff;
      if (0x400 < (uint)uVar1 + (uVar10 & 0xffff)) {
        uVar4 = 0x400 - uVar1;
      }
      pODlist->Entries = uVar1 + (short)uVar4;
      for (uVar7 = 0; (uVar4 & 0xffff) != uVar7; uVar7 = uVar7 + 1) {
        pODlist->Index[(uVar6 & 0xffff) + uVar7] = *(uint16 *)(MbxIn + uVar7 * 2 + lVar5 * 2 + 0xc);
      }
      if (0x7f < uVar8) {
        return iVar3;
      }
      uVar6 = uVar6 + (uVar4 & 0xffff);
      uVar8 = uVar8 + 1;
      lVar5 = 0;
      iVar9 = -6;
      if (MbxIn._10_2_ == 0) {
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

int ecx_readODlist(ecx_contextt *context, uint16 Slave, ec_ODlistt *pODlist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   ec_mbxbuft MbxIn, MbxOut;
   int wkc;
   uint16 x, n, i, sp, offset;
   boolean stop;
   uint8 cnt;
   boolean First;

   pODlist->Slave = Slave;
   pODlist->Entries = 0;
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x0008);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_ODLIST_REQ; /* get object description list request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0; /* fragments left */
   SDOp->wdata[0] = htoes(0x01); /* all objects */
   /* send get object description list request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      x = 0; 
      sp = 0;
      First = TRUE;
      offset = 1; /* offset to skip info header in first frame, otherwise set to 0 */
      do
      {
         stop = TRUE; /* assume this is last iteration */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
         /* got response ? */
         if (wkc > 0)
         {
            /* response should be CoE and "get object description list response" */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
                ((aSDOp->Opcode & 0x7f) == ECT_GET_ODLIST_RES))
            {
               if (First)
               {   
                  /* extract number of indexes from mailbox data size */
                  n = (etohs(aSDOp->MbxHeader.length) - (6 + 2)) / 2;
               }
               else
               {
                  /* extract number of indexes from mailbox data size */
                  n = (etohs(aSDOp->MbxHeader.length) - 6) / 2;
               }
               /* check if indexes fit in buffer structure */
               if ((sp + n) > EC_MAXODLIST)
               {
                  n = EC_MAXODLIST + 1 - sp;
                  ecx_SDOinfoerror(context, Slave, 0, 0, 0xf000000); /* Too many entries for master buffer */
                  stop = TRUE;
               }
               /* trim to maximum number of ODlist entries defined */
               if ((pODlist->Entries + n) > EC_MAXODLIST)
               {
                  n = EC_MAXODLIST - pODlist->Entries;
               }
               pODlist->Entries += n;
               /* extract indexes one by one */
               for (i = 0; i < n; i++)
               {
                  pODlist->Index[sp + i] = etohs(aSDOp->wdata[i + offset]);
               }
               sp += n;
               /* check if more fragments will follow */
               if (aSDOp->Fragments > 0)
               {   
                  stop = FALSE;
               }
               First = FALSE; 
               offset = 0;
            }
            /* got unexpected response from slave */
            else
            {
               if ((aSDOp->Opcode &  0x7f) == ECT_SDOINFO_ERROR) /* SDO info error received */
               {
                  ecx_SDOinfoerror(context, Slave, 0, 0, etohl(aSDOp->ldata[0]));
                  stop = TRUE;
               }
               else
               {
                  ecx_packeterror(context, Slave, 0, 0, 1); /* Unexpected frame returned */
               }
               wkc = 0; 
               x += 20;
            }
         }
         x++;
      }
      while ((x <= 128) && !stop);
   }
   return wkc;
}